

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall
fmt::v7::format_system_error(v7 *this,buffer<char> *out,int error_code,string_view message)

{
  char *****pppppcVar1;
  int iVar2;
  uint uVar3;
  char *****pppppcVar4;
  undefined4 in_register_00000014;
  undefined8 uVar5;
  uint uVar6;
  buffer<char> *buf_1;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_01;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  buffer<char> *buf;
  char *system_message;
  char ****local_270;
  dispatcher local_268;
  dispatcher local_248;
  char ****local_230;
  char ***local_228 [63];
  
  uVar5._4_4_ = in_register_00000014;
  uVar5._0_4_ = error_code;
  pppppcVar4 = (char *****)message.data_;
  local_248._0_8_ = &PTR_grow_001c1998;
  local_230 = (char ****)0x1f4;
  local_248.buffer_size_ = 500;
  local_248.buffer_ = (char **)local_228;
  while( true ) {
    uVar6 = (uint)out;
    local_268.error_code_ = uVar6;
    local_270 = (char ****)local_248.buffer_;
    local_268.buffer_ = (char **)&local_270;
    local_268.buffer_size_ = local_248.buffer_size_;
    iVar2 = detail::anon_func::dispatcher::run(&local_268);
    if (iVar2 != 0x22) break;
    pppppcVar1 = (char *****)(local_248.buffer_size_ * 2);
    if (local_230 < pppppcVar1) {
      (**(code **)local_248._0_8_)(&local_248,pppppcVar1);
    }
    local_248.buffer_size_ = (size_t)pppppcVar1;
    if (local_230 < pppppcVar1) {
      local_248.buffer_size_ = (size_t)local_230;
    }
  }
  if (iVar2 == 0) {
    local_268.buffer_size_ = (size_t)local_270;
    args.field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &local_268;
    args.desc_ = 0xcd;
    format_str.size_ = 6;
    format_str.data_ = "{}: {}";
    local_268._0_8_ = uVar5;
    local_268.buffer_ = (char **)pppppcVar4;
    detail::vformat_to<char>((buffer<char> *)this,format_str,args,(locale_ref)0x0);
  }
  if ((char ****)local_248.buffer_ != local_228) {
    operator_delete(local_248.buffer_,(ulong)local_230);
  }
  if (iVar2 != 0) {
    *(undefined8 *)(this + 0x10) = 0;
    uVar3 = -uVar6;
    if (0 < (int)uVar6) {
      uVar3 = uVar6;
    }
    uVar6 = 0x1f;
    if ((uVar3 | 1) != 0) {
      for (; (uVar3 | 1) >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    if (pppppcVar4 <=
        (char *****)
        (0x1ec - (((ulong)out >> 0x1f & 1) +
                 (ulong)((uint)*(ushort *)(detail::bsr2log10(int)::data + (ulong)uVar6 * 2) -
                        (uint)(uVar3 < *(uint *)(detail::basic_data<void>::
                                                 zero_or_powers_of_10_32_new +
                                                (ulong)*(ushort *)
                                                        (detail::bsr2log10(int)::data +
                                                        (ulong)uVar6 * 2) * 4)))))) {
      local_248.buffer_size_ =
           (size_t)&detail::
                    format_error_code(fmt::v7::detail::buffer<char>&,int,fmt::v7::basic_string_view<char>)
                    ::SEP;
      args_00.field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_248;
      args_00.desc_ = 0xcd;
      format_str_00.size_ = 4;
      format_str_00.data_ = "{}{}";
      local_248._0_8_ = uVar5;
      local_248.buffer_ = (char **)pppppcVar4;
      detail::vformat_to<char>((buffer<char> *)this,format_str_00,args_00,(locale_ref)0x0);
    }
    local_248.buffer_size_ = (ulong)out & 0xffffffff;
    local_248._0_8_ = "error ";
    args_01.field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &local_248;
    args_01.desc_ = 0x1c;
    format_str_01.size_ = 4;
    format_str_01.data_ = "{}{}";
    detail::vformat_to<char>((buffer<char> *)this,format_str_01,args_01,(locale_ref)0x0);
  }
  return;
}

Assistant:

FMT_FUNC void format_system_error(detail::buffer<char>& out, int error_code,
                                  string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char* system_message = &buf[0];
      int result =
          detail::safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        format_to(detail::buffer_appender<char>(out), "{}: {}", message,
                  system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }